

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_TruthMuxVarPhase(uint *pOut,uint *pCof0,uint *pCof1,int nVars,int iVar,int fCompl0)

{
  int iVar1;
  int iVar2;
  int local_38;
  int Step;
  int k;
  int i;
  int nWords;
  int fCompl0_local;
  int iVar_local;
  int nVars_local;
  uint *pCof1_local;
  uint *pCof0_local;
  uint *pOut_local;
  
  iVar1 = Kit_TruthWordNum(nVars);
  if (fCompl0 == 0) {
    Kit_TruthMuxVar(pOut,pCof0,pCof1,nVars,iVar);
  }
  else {
    if (nVars <= iVar) {
      __assert_fail("iVar < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitTruth.c"
                    ,0x470,
                    "void Kit_TruthMuxVarPhase(unsigned int *, unsigned int *, unsigned int *, int, int, int)"
                   );
    }
    switch(iVar) {
    case 0:
      for (Step = 0; Step < iVar1; Step = Step + 1) {
        pOut[Step] = (pCof0[Step] ^ 0xffffffff) & 0x55555555 | pCof1[Step] & 0xaaaaaaaa;
      }
      break;
    case 1:
      for (Step = 0; Step < iVar1; Step = Step + 1) {
        pOut[Step] = (pCof0[Step] ^ 0xffffffff) & 0x33333333 | pCof1[Step] & 0xcccccccc;
      }
      break;
    case 2:
      for (Step = 0; Step < iVar1; Step = Step + 1) {
        pOut[Step] = (pCof0[Step] ^ 0xffffffff) & 0xf0f0f0f | pCof1[Step] & 0xf0f0f0f0;
      }
      break;
    case 3:
      for (Step = 0; Step < iVar1; Step = Step + 1) {
        pOut[Step] = (pCof0[Step] ^ 0xffffffff) & 0xff00ff | pCof1[Step] & 0xff00ff00;
      }
      break;
    case 4:
      for (Step = 0; Step < iVar1; Step = Step + 1) {
        pOut[Step] = (pCof0[Step] ^ 0xffffffff) & 0xffff | pCof1[Step] & 0xffff0000;
      }
      break;
    default:
      iVar2 = 1 << ((char)iVar - 5U & 0x1f);
      _iVar_local = pCof1;
      pCof1_local = pCof0;
      pCof0_local = pOut;
      for (local_38 = 0; local_38 < iVar1; local_38 = iVar2 * 2 + local_38) {
        for (Step = 0; Step < iVar2; Step = Step + 1) {
          pCof0_local[Step] = pCof1_local[Step] ^ 0xffffffff;
          pCof0_local[iVar2 + Step] = _iVar_local[iVar2 + Step];
        }
        pCof0_local = pCof0_local + (iVar2 << 1);
        pCof1_local = pCof1_local + (iVar2 << 1);
        _iVar_local = _iVar_local + (iVar2 << 1);
      }
    }
  }
  return;
}

Assistant:

void Kit_TruthMuxVarPhase( unsigned * pOut, unsigned * pCof0, unsigned * pCof1, int nVars, int iVar, int fCompl0 )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    if ( fCompl0 == 0 )
    {
        Kit_TruthMuxVar( pOut, pCof0, pCof1, nVars, iVar );
        return;
    }

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~pCof0[i] & 0x55555555) | (pCof1[i] & 0xAAAAAAAA);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~pCof0[i] & 0x33333333) | (pCof1[i] & 0xCCCCCCCC);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~pCof0[i] & 0x0F0F0F0F) | (pCof1[i] & 0xF0F0F0F0);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~pCof0[i] & 0x00FF00FF) | (pCof1[i] & 0xFF00FF00);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~pCof0[i] & 0x0000FFFF) | (pCof1[i] & 0xFFFF0000);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pOut[i]      = ~pCof0[i];
                pOut[Step+i] = pCof1[Step+i];
            }
            pOut += 2*Step;
            pCof0 += 2*Step;
            pCof1 += 2*Step;
        }
        return;
    }
}